

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wint_t ** terminal_alloc_buffer(EditLine *el)

{
  wchar_t *pwVar1;
  wchar_t local_2c;
  wchar_t i;
  coord_t *c;
  wint_t **b;
  EditLine *el_local;
  
  el_local = (EditLine *)calloc((long)((el->el_terminal).t_size.v + L'\x01'),8);
  if (el_local == (EditLine *)0x0) {
    el_local = (EditLine *)0x0;
  }
  else {
    for (local_2c = L'\0'; local_2c < (el->el_terminal).t_size.v; local_2c = local_2c + L'\x01') {
      pwVar1 = (wchar_t *)calloc((long)((el->el_terminal).t_size.h + L'\x01'),4);
      (&el_local->el_prog)[local_2c] = pwVar1;
      if ((&el_local->el_prog)[local_2c] == (wchar_t *)0x0) {
        while (local_2c = local_2c + L'\xffffffff', L'\xffffffff' < local_2c) {
          free((&el_local->el_prog)[local_2c]);
        }
        free(el_local);
        return (wint_t **)0x0;
      }
    }
    (&el_local->el_prog)[(el->el_terminal).t_size.v] = (wchar_t *)0x0;
  }
  return (wint_t **)el_local;
}

Assistant:

static wint_t **
terminal_alloc_buffer(EditLine *el)
{
	wint_t **b;
	coord_t *c = &el->el_terminal.t_size;
	int i;

	b =  el_calloc((size_t)(c->v + 1), sizeof(*b));
	if (b == NULL)
		return NULL;
	for (i = 0; i < c->v; i++) {
		b[i] = el_calloc((size_t)(c->h + 1), sizeof(**b));
		if (b[i] == NULL) {
			while (--i >= 0)
				el_free(b[i]);
			el_free(b);
			return NULL;
		}
	}
	b[c->v] = NULL;
	return b;
}